

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

void msr_get_limits(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,raplcap_limit *limit_long
                   ,raplcap_limit *limit_short)

{
  double dVar1;
  uint64_t local_40;
  uint64_t pl_mask;
  uint8_t tw2_shift;
  raplcap_limit *prStack_30;
  uint8_t tw1_shift;
  raplcap_limit *limit_short_local;
  raplcap_limit *limit_long_local;
  uint64_t msrval_local;
  raplcap_msr_ctx *prStack_10;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  prStack_30 = limit_short;
  limit_short_local = limit_long;
  limit_long_local = (raplcap_limit *)msrval;
  msrval_local._4_4_ = zone;
  prStack_10 = ctx;
  if (ctx != (raplcap_msr_ctx *)0x0) {
    pl_mask._7_1_ = 0x11;
    pl_mask._6_1_ = 0x31;
    local_40 = 0x7fff;
    zone_limits_quirks(ctx,zone,(uint8_t *)0x0,(uint8_t *)((long)&pl_mask + 7),(uint8_t *)0x0,
                       (uint8_t *)0x0,(uint8_t *)((long)&pl_mask + 6),(uint8_t *)0x0,&local_40);
    if (limit_short_local != (raplcap_limit *)0x0) {
      dVar1 = (*prStack_10->cfg[msrval_local._4_4_].from_msr_pl)
                        ((ulong)limit_long_local & local_40,prStack_10->power_units);
      limit_short_local->watts = dVar1;
      dVar1 = (*prStack_10->cfg[msrval_local._4_4_].from_msr_tw)
                        ((ulong)limit_long_local >> (pl_mask._7_1_ & 0x3f) & 0x7f,
                         prStack_10->time_units);
      limit_short_local->seconds = dVar1;
    }
    if ((prStack_30 != (raplcap_limit *)0x0) &&
       (1 < prStack_10->cfg[msrval_local._4_4_].constraints)) {
      dVar1 = (*prStack_10->cfg[msrval_local._4_4_].from_msr_pl)
                        ((ulong)limit_long_local >> 0x20 & local_40,prStack_10->power_units);
      prStack_30->watts = dVar1;
      dVar1 = (*prStack_10->cfg[msrval_local._4_4_].from_msr_tw)
                        ((ulong)limit_long_local >> (pl_mask._6_1_ & 0x3f) & 0x7f,
                         prStack_10->time_units);
      prStack_30->seconds = dVar1;
    }
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x287,
                "void msr_get_limits(const raplcap_msr_ctx *, raplcap_zone, uint64_t, raplcap_limit *, raplcap_limit *)"
               );
}

Assistant:

void msr_get_limits(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                    raplcap_limit* limit_long, raplcap_limit* limit_short) {
  assert(ctx != NULL);
  uint8_t tw1_shift = TL1_SHIFT;
  uint8_t tw2_shift = TL2_SHIFT;
  uint64_t pl_mask = PL_MASK;
  zone_limits_quirks(ctx, zone, NULL, &tw1_shift, NULL, NULL, &tw2_shift, NULL, &pl_mask);
  if (limit_long != NULL) {
    limit_long->watts = ctx->cfg[zone].from_msr_pl((msrval >> PL1_SHIFT) & pl_mask, ctx->power_units);
    limit_long->seconds = ctx->cfg[zone].from_msr_tw((msrval >> tw1_shift) & TL_MASK, ctx->time_units);
    raplcap_log(DEBUG, "msr_get_limits: zone=%d, long_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_long->seconds, limit_long->watts);
  }
  if (limit_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    limit_short->watts = ctx->cfg[zone].from_msr_pl((msrval >> PL2_SHIFT) & pl_mask, ctx->power_units);
    if (zone == RAPLCAP_ZONE_PSYS) {
      raplcap_log(DEBUG, "msr_get_limits: Documentation does not specify PSys/Platform short term time window\n");
    }
    limit_short->seconds = ctx->cfg[zone].from_msr_tw((msrval >> tw2_shift) & TL_MASK, ctx->time_units);
    raplcap_log(DEBUG, "msr_get_limits: zone=%d, short_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_short->seconds, limit_short->watts);
  }
}